

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_name_resolver.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::java::ClassNameResolver::GetKotlinFactoryName_abi_cxx11_
          (string *__return_storage_ptr__,ClassNameResolver *this,Descriptor *descriptor)

{
  bool bVar1;
  string name;
  
  ToCamelCase(&name,*(string **)(descriptor + 8),true);
  bVar1 = IsForbiddenKotlin(&name);
  if (bVar1) {
    std::operator+(__return_storage_ptr__,&name,"_");
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&name);
  }
  std::__cxx11::string::~string((string *)&name);
  return __return_storage_ptr__;
}

Assistant:

std::string ClassNameResolver::GetKotlinFactoryName(
    const Descriptor* descriptor) {
  std::string name = ToCamelCase(descriptor->name(), /* lower_first = */ true);
  return IsForbiddenKotlin(name) ? name + "_" : name;
}